

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

quicly_stream_t *
open_stream(quicly_conn_t *conn,uint64_t stream_id,uint32_t initial_max_stream_data_local,
           uint64_t initial_max_stream_data_remote)

{
  undefined1 *puVar1;
  anon_struct_32_2_6d702f80_for_pending_link *paVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  kh_quicly_stream_t_t *h;
  khint32_t *pkVar5;
  ulong uVar6;
  quicly_context_t *pqVar7;
  int iVar8;
  uint32_t uVar9;
  quicly_stream_t *pqVar10;
  quicly_linklist_t *pqVar11;
  sbyte sVar12;
  byte bVar13;
  uint uVar14;
  khint_t kVar15;
  uint uVar16;
  uint uVar17;
  khint_t kVar18;
  uint uVar19;
  khint_t kVar20;
  uint uVar21;
  bool bVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 in_ZMM1 [64];
  
  auVar25 = in_ZMM1._0_16_;
  pqVar10 = (quicly_stream_t *)malloc(0x128);
  if (pqVar10 == (quicly_stream_t *)0x0) {
    return (quicly_stream_t *)0x0;
  }
  pqVar10->conn = conn;
  pqVar10->stream_id = stream_id;
  pqVar10->callbacks = (quicly_stream_callbacks_t *)0x0;
  pqVar10->data = (void *)0x0;
  h = conn->streams;
  uVar16 = (uint)stream_id;
  if (h->upper_bound <= h->n_occupied) {
    uVar17 = h->n_buckets;
    if (h->size * 2 < uVar17) {
      kVar18 = uVar17 - 1;
    }
    else {
      kVar18 = uVar17 + 1;
    }
    iVar8 = kh_resize_quicly_stream_t(h,kVar18);
    if (iVar8 < 0) {
      kVar20 = h->n_buckets;
      goto LAB_00121cd0;
    }
  }
  kVar18 = h->n_buckets;
  kVar20 = ((uint)(stream_id >> 0x21) ^ uVar16 << 0xb ^ uVar16) & kVar18 - 1;
  pkVar5 = h->flags;
  if ((pkVar5[kVar20 >> 4] >> ((char)kVar20 * '\x02' & 0x1fU) & 2) == 0) {
    iVar8 = 1;
    kVar15 = kVar18;
    uVar17 = kVar20;
    do {
      uVar19 = pkVar5[uVar17 >> 4];
      uVar14 = uVar17 * 2 & 0x1e;
      sVar12 = (sbyte)uVar14;
      uVar21 = uVar19 >> sVar12;
      if (((uVar21 & 2) != 0) || (((uVar21 & 1) == 0 && (h->keys[uVar17] == stream_id)))) {
        bVar23 = (uVar19 >> sVar12 & 2) == 0;
        goto LAB_00121c50;
      }
      if ((uVar19 >> uVar14 & 1) != 0) {
        kVar15 = uVar17;
      }
      uVar17 = uVar17 + iVar8 & kVar18 - 1;
      iVar8 = iVar8 + 1;
    } while (uVar17 != kVar20);
    bVar23 = true;
    bVar22 = kVar15 == kVar18;
    uVar17 = kVar20;
    kVar20 = kVar15;
    kVar15 = kVar18;
    if (bVar22) {
LAB_00121c50:
      if (kVar15 == kVar18) {
        kVar15 = uVar17;
      }
      kVar20 = kVar15;
      if (bVar23) {
        kVar20 = uVar17;
      }
    }
  }
  uVar19 = kVar20 >> 4;
  uVar17 = pkVar5[uVar19];
  bVar13 = (char)kVar20 * '\x02' & 0x1e;
  if ((uVar17 >> bVar13 & 2) == 0) {
    if ((uVar17 >> bVar13 & 1) != 0) {
      h->keys[kVar20] = stream_id;
      pkVar5[uVar19] = uVar17 & ~(3 << bVar13);
      h->size = h->size + 1;
    }
  }
  else {
    h->keys[kVar20] = stream_id;
    pkVar5[uVar19] = uVar17 & ~(3 << bVar13);
    uVar3 = h->size;
    uVar4 = h->n_occupied;
    auVar24._4_4_ = uVar4;
    auVar24._0_4_ = uVar3;
    auVar25 = vpcmpeqd_avx(auVar25,auVar25);
    auVar24._8_8_ = 0;
    auVar25 = vpsubd_avx(auVar24,auVar25);
    h->size = (int)auVar25._0_8_;
    h->n_occupied = (int)((ulong)auVar25._0_8_ >> 0x20);
  }
LAB_00121cd0:
  if (kVar20 != conn->streams->n_buckets) {
    conn->streams->vals[kVar20] = pqVar10;
    uVar17 = ~(uint)(conn->super).local.bidi.next_stream_id & 1;
    if ((((uVar16 & 1) == uVar17) && (-1 < (long)stream_id)) && ((stream_id & 2) != 0)) {
      quicly_sendstate_init_closed(&pqVar10->sendstate);
    }
    else {
      quicly_sendstate_init(&pqVar10->sendstate);
    }
    uVar6 = pqVar10->stream_id;
    if (((((uint)uVar6 & 1) == uVar17) || ((long)uVar6 < 0)) || ((uVar6 & 2) == 0)) {
      quicly_recvstate_init(&pqVar10->recvstate);
    }
    else {
      quicly_recvstate_init_closed(&pqVar10->recvstate);
    }
    pqVar10->field_0xb8 = pqVar10->field_0xb8 & 0xfe;
    (pqVar10->_send_aux).max_stream_data = initial_max_stream_data_remote;
    (pqVar10->_send_aux).stop_sending.sender_state = QUICLY_SENDER_STATE_NONE;
    (pqVar10->_send_aux).stop_sending.error_code = 0;
    (pqVar10->_send_aux).reset_stream.sender_state = QUICLY_SENDER_STATE_NONE;
    (pqVar10->_send_aux).reset_stream.error_code = 0;
    (pqVar10->_send_aux).max_stream_data_sender.max_committed = (ulong)initial_max_stream_data_local
    ;
    (pqVar10->_send_aux).max_stream_data_sender.max_acked = (ulong)initial_max_stream_data_local;
    (pqVar10->_send_aux).max_stream_data_sender.num_inflight = 0;
    puVar1 = &(pqVar10->_send_aux).max_stream_data_sender.field_0x18;
    *puVar1 = *puVar1 & 0xfe;
    (pqVar10->_send_aux).blocked = QUICLY_SENDER_STATE_NONE;
    paVar2 = &(pqVar10->_send_aux).pending_link;
    (pqVar10->_send_aux).pending_link.control.next = &paVar2->control;
    (pqVar10->_send_aux).pending_link.control.prev = &paVar2->control;
    pqVar11 = &(pqVar10->_send_aux).pending_link.default_scheduler;
    (pqVar10->_send_aux).pending_link.default_scheduler.next = pqVar11;
    (pqVar10->_send_aux).pending_link.default_scheduler.prev = pqVar11;
    (pqVar10->_recv_aux).window = initial_max_stream_data_local;
    pqVar7 = (pqVar10->conn->super).ctx;
    uVar17 = (int)(pqVar7->transport_params).max_streams_bidi +
             (int)(pqVar7->transport_params).max_streams_uni;
    uVar16 = initial_max_stream_data_local >> 10;
    if (initial_max_stream_data_local >> 10 < uVar17) {
      uVar16 = uVar17;
    }
    uVar9 = 0x3f;
    if (0x3f < uVar16) {
      uVar9 = uVar16;
    }
    (pqVar10->_recv_aux).max_ranges = uVar9;
    return pqVar10;
  }
  __assert_fail("iter != kh_end(conn->streams)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                ,0x42b,"quicly_stream_t *open_stream(quicly_conn_t *, uint64_t, uint32_t, uint64_t)"
               );
}

Assistant:

static quicly_stream_t *open_stream(quicly_conn_t *conn, uint64_t stream_id, uint32_t initial_max_stream_data_local,
                                    uint64_t initial_max_stream_data_remote)
{
    quicly_stream_t *stream;

    if ((stream = malloc(sizeof(*stream))) == NULL)
        return NULL;
    stream->conn = conn;
    stream->stream_id = stream_id;
    stream->callbacks = NULL;
    stream->data = NULL;

    int r;
    khiter_t iter = kh_put(quicly_stream_t, conn->streams, stream_id, &r);
    assert(iter != kh_end(conn->streams));
    kh_val(conn->streams, iter) = stream;

    init_stream_properties(stream, initial_max_stream_data_local, initial_max_stream_data_remote);

    return stream;
}